

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O2

buffer_type *
rest_rpc::rpc_service::msgpack_codec::pack_args<person>
          (buffer_type *__return_storage_ptr__,person *args)

{
  tuple<person_&&> local_18;
  
  msgpack::v1::sbuffer::sbuffer(__return_storage_ptr__,0x800);
  local_18.super__Tuple_impl<0UL,_person_&&>.super__Head_base<0UL,_person_&&,_false>._M_head_impl =
       (_Tuple_impl<0UL,_person_&&>)(_Tuple_impl<0UL,_person_&&>)args;
  msgpack::v1::pack<msgpack::v1::sbuffer,std::tuple<person&&>>(__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

static buffer_type pack_args(Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer, std::forward_as_tuple(std::forward<Args>(args)...));
    return buffer;
  }